

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

locateresult __thiscall
tetgenmesh::locate(tetgenmesh *this,point searchpt,triface *searchtet,int chkencflag)

{
  int iVar1;
  bool bVar2;
  point pdVar3;
  unsigned_long uVar4;
  char cVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int s;
  int t1ver;
  locateresult loc;
  double oriapex;
  double oridest;
  double oriorg;
  double ori;
  anon_enum_32 nextmove;
  point toppo;
  point tapex;
  point tdest;
  point torg;
  int chkencflag_local;
  triface *searchtet_local;
  point searchpt_local;
  tetgenmesh *this_local;
  
  if (searchtet->tet == (tetrahedron *)0x0) {
    searchtet->tet = (this->recenttet).tet;
  }
  bVar2 = ishulltet(this,searchtet);
  if (bVar2) {
    searchtet->ver = 3;
    iVar1 = searchtet->ver;
    decode(this,searchtet->tet[(int)(searchtet->ver & 3)],searchtet);
    searchtet->ver = fsymtbl[iVar1][searchtet->ver];
  }
  searchtet->ver = 0;
  while (searchtet->ver < 4) {
    tdest = org(this,searchtet);
    tapex = dest(this,searchtet);
    toppo = apex(this,searchtet);
    dVar6 = orient3d(tdest,tapex,toppo,searchpt);
    if (dVar6 < 0.0) break;
    searchtet->ver = searchtet->ver + 1;
  }
  if (searchtet->ver == 4) {
    terminatetetgen(this,2);
  }
  do {
    pdVar3 = oppo(this,searchtet);
    if (pdVar3 == searchpt) {
      esymself(this,searchtet);
      eprevself(this,searchtet);
      return ONVERTEX;
    }
    dVar6 = orient3d(tapex,toppo,pdVar3,searchpt);
    dVar7 = orient3d(toppo,tdest,pdVar3,searchpt);
    dVar8 = orient3d(tdest,tapex,pdVar3,searchpt);
    if (0.0 <= dVar6) {
      if (0.0 <= dVar7) {
        if (0.0 <= dVar8) {
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            if ((dVar7 == 0.0) && (!NAN(dVar7))) {
              eprevesymself(this,searchtet);
              if ((dVar8 == 0.0) && (!NAN(dVar8))) {
                eprevself(this,searchtet);
                return ONEDGE;
              }
              return ONFACE;
            }
            if ((dVar8 == 0.0) && (!NAN(dVar8))) {
              esymself(this,searchtet);
              return ONFACE;
            }
            return INTETRAHEDRON;
          }
          enextesymself(this,searchtet);
          if ((dVar7 == 0.0) && (!NAN(dVar7))) {
            eprevself(this,searchtet);
            if ((dVar8 == 0.0) && (!NAN(dVar8))) {
              return ONVERTEX;
            }
            return ONEDGE;
          }
          if ((dVar8 == 0.0) && (!NAN(dVar8))) {
            enextself(this,searchtet);
            return ONEDGE;
          }
          return ONFACE;
        }
        cVar5 = '\x02';
      }
      else if (0.0 <= dVar8) {
        cVar5 = '\x01';
      }
      else {
        uVar4 = randomnation(this,2);
        if (uVar4 == 0) {
          cVar5 = '\x02';
        }
        else {
          cVar5 = '\x01';
        }
      }
    }
    else if (0.0 <= dVar7) {
      if (0.0 <= dVar8) {
        cVar5 = '\0';
      }
      else {
        uVar4 = randomnation(this,2);
        if (uVar4 == 0) {
          cVar5 = '\x02';
        }
        else {
          cVar5 = '\0';
        }
      }
    }
    else if (0.0 <= dVar8) {
      uVar4 = randomnation(this,2);
      cVar5 = uVar4 == 0;
    }
    else {
      uVar4 = randomnation(this,3);
      if ((int)uVar4 == 0) {
        cVar5 = '\0';
      }
      else if ((int)uVar4 == 1) {
        cVar5 = '\x01';
      }
      else {
        cVar5 = '\x02';
      }
    }
    if (cVar5 == '\0') {
      enextesymself(this,searchtet);
    }
    else if (cVar5 == '\x01') {
      eprevesymself(this,searchtet);
    }
    else {
      esymself(this,searchtet);
    }
    if (((chkencflag != 0) && (searchtet->tet[9] != (tetrahedron)0x0)) &&
       (searchtet->tet[9][(int)(searchtet->ver & 3)] != (double *)0x0)) {
      return ENCSUBFACE;
    }
    iVar1 = searchtet->ver;
    decode(this,searchtet->tet[(int)(searchtet->ver & 3)],searchtet);
    searchtet->ver = fsymtbl[iVar1][searchtet->ver];
    pdVar3 = oppo(this,searchtet);
    if (pdVar3 == this->dummypoint) {
      return OUTSIDE;
    }
    tdest = org(this,searchtet);
    tapex = dest(this,searchtet);
    toppo = apex(this,searchtet);
  } while( true );
}

Assistant:

enum tetgenmesh::locateresult 
  tetgenmesh::locate(point searchpt, triface* searchtet, int chkencflag)
{
  point torg, tdest, tapex, toppo;
  enum {ORGMOVE, DESTMOVE, APEXMOVE} nextmove;
  REAL ori, oriorg, oridest, oriapex;
  enum locateresult loc = OUTSIDE;
  int t1ver;
  int s;

  if (searchtet->tet == NULL) {
    // A null tet. Choose the recenttet as the starting tet.
    searchtet->tet = recenttet.tet;
  }

  // Check if we are in the outside of the convex hull.
  if (ishulltet(*searchtet)) {
    // Get its adjacent tet (inside the hull).
    searchtet->ver = 3;
    fsymself(*searchtet);
  }

  // Let searchtet be the face such that 'searchpt' lies above to it.
  for (searchtet->ver = 0; searchtet->ver < 4; searchtet->ver++) {
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);
    ori = orient3d(torg, tdest, tapex, searchpt); 
    if (ori < 0.0) break;
  }
  if (searchtet->ver == 4) {
    terminatetetgen(this, 2);
  }

  // Walk through tetrahedra to locate the point.
  while (true) {

    toppo = oppo(*searchtet);
    
    // Check if the vertex is we seek.
    if (toppo == searchpt) {
      // Adjust the origin of searchtet to be searchpt.
      esymself(*searchtet);
      eprevself(*searchtet);
      loc = ONVERTEX; // return ONVERTEX;
      break;
    }

    // We enter from one of serarchtet's faces, which face do we exit?
    oriorg = orient3d(tdest, tapex, toppo, searchpt); 
    oridest = orient3d(tapex, torg, toppo, searchpt);
    oriapex = orient3d(torg, tdest, toppo, searchpt);

    // Now decide which face to move. It is possible there are more than one
    //   faces are viable moves. If so, randomly choose one.
    if (oriorg < 0) {
      if (oridest < 0) {
        if (oriapex < 0) {
          // All three faces are possible.
          s = randomnation(3); // 's' is in {0,1,2}.
          if (s == 0) {
            nextmove = ORGMOVE;
          } else if (s == 1) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Two faces, opposite to origin and destination, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = DESTMOVE;
          }
        }
      } else {
        if (oriapex < 0) {
          // Two faces, opposite to origin and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to origin is viable.
          nextmove = ORGMOVE;
        }
      }
    } else {
      if (oridest < 0) {
        if (oriapex < 0) {
          // Two faces, opposite to destination and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to destination is viable.
          nextmove = DESTMOVE;
        }
      } else {
        if (oriapex < 0) {
          // Only the face opposite to apex is viable.
          nextmove = APEXMOVE;
        } else {
          // The point we seek must be on the boundary of or inside this
          //   tetrahedron. Check for boundary cases.
          if (oriorg == 0) {
            // Go to the face opposite to origin.
            enextesymself(*searchtet);
            if (oridest == 0) {
              eprevself(*searchtet); // edge oppo->apex
              if (oriapex == 0) {
                // oppo is duplicated with p.
                loc = ONVERTEX; // return ONVERTEX;
                break;
              }
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            if (oriapex == 0) {
              enextself(*searchtet); // edge dest->oppo
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oridest == 0) {
            // Go to the face opposite to destination.
            eprevesymself(*searchtet);
            if (oriapex == 0) {
              eprevself(*searchtet); // edge oppo->org
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oriapex == 0) {
            // Go to the face opposite to apex
            esymself(*searchtet);
            loc = ONFACE; // return ONFACE;
            break;
          }
          loc = INTETRAHEDRON; // return INTETRAHEDRON;
          break;
        }
      }
    }
    
    // Move to the selected face.
    if (nextmove == ORGMOVE) {
      enextesymself(*searchtet);
    } else if (nextmove == DESTMOVE) {
      eprevesymself(*searchtet);
    } else {
      esymself(*searchtet);
    }
    if (chkencflag) {
      // Check if we are walking across a subface.
      if (issubface(*searchtet)) {
        loc = ENCSUBFACE;
        break;
      }
    }
    // Move to the adjacent tetrahedron (maybe a hull tetrahedron).
    fsymself(*searchtet);
    if (oppo(*searchtet) == dummypoint) {
      loc = OUTSIDE; // return OUTSIDE;
      break;
    }

    // Retreat the three vertices of the base face.
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);

  } // while (true)

  return loc;
}